

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq2psf.cpp
# Opt level: O0

bool build_choroq_psf(char *psf_path,uint8_t *tsq,size_t tsq_size,uint8_t *tvb,size_t tvb_size,
                     bool write_driver,char *driver_psflib_path,bool write_param,int song_index,
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *tags)

{
  char *region_name_00;
  uint32_t initial_sp_00;
  uint32_t initial_pc_00;
  uint load_address_00;
  uint8_t *psf_path_00;
  bool bVar1;
  int iVar2;
  PSFFile *pPVar3;
  ssize_t sVar4;
  uint *puVar5;
  uint8_t *rom;
  ulong rom_size_00;
  size_t sVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_900;
  uint local_8d0;
  uint local_8cc;
  uint32_t rom_size;
  uint local_8c4 [3];
  uint local_8b8;
  uint local_8b4;
  char *local_8b0;
  char *region_name;
  uint32_t initial_sp;
  uint32_t initial_pc;
  uint32_t driver_load_size;
  uint32_t driver_load_address;
  uint8_t psx_exe_header [2048];
  allocator local_79;
  string local_78 [32];
  PSFFile *local_58;
  PSFFile *driver_psflib;
  uint32_t load_end_address;
  uint32_t load_address;
  uint8_t *mem;
  bool write_param_local;
  size_t sStack_38;
  bool write_driver_local;
  size_t tvb_size_local;
  uint8_t *tvb_local;
  size_t tsq_size_local;
  uint8_t *tsq_local;
  char *psf_path_local;
  
  sVar6 = CONCAT71((int7)((ulong)tsq >> 8),write_driver) & 0xffffffffffffff01;
  mem._7_1_ = (byte)sVar6;
  mem._6_1_ = write_param;
  sStack_38 = tvb_size;
  tvb_size_local = (size_t)tvb;
  tvb_local = (uint8_t *)tsq_size;
  tsq_size_local = (size_t)tsq;
  tsq_local = (uint8_t *)psf_path;
  _load_end_address = operator_new__(0x200000);
  if (_load_end_address == (void *)0x0) {
    fprintf(_stderr,"Error: Memory allocation error\n");
    psf_path_local._7_1_ = false;
  }
  else {
    memset(_load_end_address,0,0x200000);
    driver_psflib._4_4_ = 0x80200000;
    driver_psflib._0_4_ = 0x80000000;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,driver_psflib_path,&local_79);
    pPVar3 = PSFFile::load((string *)local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    local_58 = pPVar3;
    if (pPVar3 == (PSFFile *)0x0) {
      fprintf(_stderr,"Error: Unable to read \"%s\"\n",driver_psflib_path);
      if (_load_end_address != (void *)0x0) {
        operator_delete__(_load_end_address);
      }
      psf_path_local._7_1_ = false;
    }
    else if (pPVar3->version == '\x01') {
      sVar4 = ZlibReader::read(&pPVar3->compressed_exe,(int)&driver_load_size,(void *)0x800,sVar6);
      if ((int)sVar4 == 0x800) {
        initial_pc = readInt(psx_exe_header + 0x10);
        initial_sp = readInt(psx_exe_header + 0x14);
        region_name._4_4_ = readInt(psx_exe_header + 8);
        region_name._0_4_ = readInt(psx_exe_header + 0x28);
        sVar6 = 0x45584520582d5350;
        if ((_driver_load_size == 0x45584520582d5350) &&
           ((initial_pc & 0xffffff) + initial_sp < 0x200000)) {
          iVar2 = strcmp((char *)(psx_exe_header + 0x44),
                         "Sony Computer Entertainment Inc. for Japan area");
          if (iVar2 == 0) {
            local_8b0 = "Japan";
          }
          else {
            iVar2 = strcmp((char *)(psx_exe_header + 0x44),
                           "Sony Computer Entertainment Inc. for North America area");
            if (iVar2 == 0) {
              local_8b0 = "North America";
            }
            else {
              iVar2 = strcmp((char *)(psx_exe_header + 0x44),
                             "Sony Computer Entertainment Inc. for Europe area");
              if (iVar2 == 0) {
                local_8b0 = "Europe";
              }
              else {
                fprintf(_stderr,"Warning: Unknown region name \"%s\"\n",driver_psflib_path);
                local_8b0 = "North America";
              }
            }
          }
          if ((mem._7_1_ & 1) != 0) {
            sVar4 = ZlibReader::read(&local_58->compressed_exe,
                                     (int)_load_end_address + (initial_pc & 0xffffff),
                                     (void *)(ulong)initial_sp,sVar6);
            if ((uint32_t)sVar4 != initial_sp) {
              fprintf(_stderr,"Error: Unable to read driver block \"%s\"\n",driver_psflib_path);
              if (local_58 != (PSFFile *)0x0) {
                (*local_58->_vptr_PSFFile[1])();
              }
              if (_load_end_address != (void *)0x0) {
                operator_delete__(_load_end_address);
              }
              return false;
            }
            puVar5 = std::min<unsigned_int>((uint *)((long)&driver_psflib + 4),&initial_pc);
            driver_psflib._4_4_ = *puVar5;
            local_8b4 = initial_pc + initial_sp;
            puVar5 = std::max<unsigned_int>((uint *)&driver_psflib,&local_8b4);
            driver_psflib._0_4_ = *puVar5;
          }
          if (local_58 != (PSFFile *)0x0) {
            (*local_58->_vptr_PSFFile[1])();
          }
          if ((tsq_size_local != 0) && (tvb_local != (uint8_t *)0x0)) {
            memcpy((void *)((long)_load_end_address + 0xf0000),(void *)tsq_size_local,
                   (size_t)tvb_local);
            local_8b8 = 0x800f0000;
            puVar5 = std::min<unsigned_int>((uint *)((long)&driver_psflib + 4),&local_8b8);
            driver_psflib._4_4_ = *puVar5;
            local_8c4[2] = (int)tvb_local + -0x7ff10000;
            puVar5 = std::max<unsigned_int>((uint *)&driver_psflib,local_8c4 + 2);
            driver_psflib._0_4_ = *puVar5;
          }
          if ((tvb_size_local != 0) && (sStack_38 != 0)) {
            memcpy((void *)((long)_load_end_address + 0x1d800),(void *)tvb_size_local,sStack_38);
            local_8c4[1] = 0x8001d800;
            puVar5 = std::min<unsigned_int>((uint *)((long)&driver_psflib + 4),local_8c4 + 1);
            driver_psflib._4_4_ = *puVar5;
            local_8c4[0] = (int)sStack_38 + 0x8001d800;
            puVar5 = std::max<unsigned_int>((uint *)&driver_psflib,local_8c4);
            driver_psflib._0_4_ = *puVar5;
          }
          if ((mem._6_1_ & 1) != 0) {
            writeByte((uint8_t *)((long)_load_end_address + 0xef800),(uint8_t)song_index);
            rom_size = 0x800ef800;
            puVar5 = std::min<unsigned_int>((uint *)((long)&driver_psflib + 4),&rom_size);
            driver_psflib._4_4_ = *puVar5;
            local_8cc = 0x800ef808;
            puVar5 = std::max<unsigned_int>((uint *)&driver_psflib,&local_8cc);
            driver_psflib._0_4_ = *puVar5;
          }
          psf_path_00 = tsq_local;
          load_address_00 = driver_psflib._4_4_;
          initial_pc_00 = region_name._4_4_;
          initial_sp_00 = (uint32_t)region_name;
          region_name_00 = local_8b0;
          local_8d0 = (uint)driver_psflib - driver_psflib._4_4_;
          rom = (uint8_t *)((long)_load_end_address + (ulong)(driver_psflib._4_4_ & 0xffffff));
          rom_size_00 = (ulong)local_8d0;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map(&local_900,tags);
          bVar1 = save_psf1((char *)psf_path_00,rom,load_address_00,rom_size_00,initial_pc_00,
                            initial_sp_00,region_name_00,&local_900);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map(&local_900);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            if (_load_end_address != (void *)0x0) {
              operator_delete__(_load_end_address);
            }
            psf_path_local._7_1_ = true;
          }
          else {
            if (_load_end_address != (void *)0x0) {
              operator_delete__(_load_end_address);
            }
            psf_path_local._7_1_ = false;
          }
        }
        else {
          fprintf(_stderr,"Error: Invalid PS-X EXE header \"%s\"\n",driver_psflib_path);
          if (local_58 != (PSFFile *)0x0) {
            (*local_58->_vptr_PSFFile[1])();
          }
          if (_load_end_address != (void *)0x0) {
            operator_delete__(_load_end_address);
          }
          psf_path_local._7_1_ = false;
        }
      }
      else {
        fprintf(_stderr,"Error: Unable to read PS-X EXE header \"%s\"\n",driver_psflib_path);
        if (local_58 != (PSFFile *)0x0) {
          (*local_58->_vptr_PSFFile[1])();
        }
        if (_load_end_address != (void *)0x0) {
          operator_delete__(_load_end_address);
        }
        psf_path_local._7_1_ = false;
      }
    }
    else {
      fprintf(_stderr,"Error: Invalid PSF version \"%s\"\n",driver_psflib_path);
      if (local_58 != (PSFFile *)0x0) {
        (*local_58->_vptr_PSFFile[1])();
      }
      if (_load_end_address != (void *)0x0) {
        operator_delete__(_load_end_address);
      }
      psf_path_local._7_1_ = false;
    }
  }
  return psf_path_local._7_1_;
}

Assistant:

bool build_choroq_psf(const char * psf_path, const uint8_t * tsq, size_t tsq_size, const uint8_t * tvb, size_t tvb_size, bool write_driver, const char * driver_psflib_path, bool write_param, int song_index, std::map<std::string, std::string> tags)
{
	uint8_t * mem = new uint8_t[PSX_MEMORY_SIZE];
	if (mem == NULL) {
		fprintf(stderr, "Error: Memory allocation error\n");
		return false;
	}
	memset(mem, 0, PSX_MEMORY_SIZE);

	uint32_t load_address = 0x80000000 | PSX_MEMORY_SIZE;
	uint32_t load_end_address = 0x80000000 | 0;

	PSFFile * driver_psflib = PSFFile::load(driver_psflib_path);
	if (driver_psflib == NULL) {
		fprintf(stderr, "Error: Unable to read \"%s\"\n", driver_psflib_path);
		delete[] mem;
		return false;
	}

	if (driver_psflib->version != PSF1_PSF_VERSION) {
		fprintf(stderr, "Error: Invalid PSF version \"%s\"\n", driver_psflib_path);
		delete driver_psflib;
		delete[] mem;
		return false;
	}

	uint8_t psx_exe_header[PSF1_EXE_HEADER_SIZE];
	if (driver_psflib->compressed_exe.read(psx_exe_header, PSF1_EXE_HEADER_SIZE) != PSF1_EXE_HEADER_SIZE) {
		fprintf(stderr, "Error: Unable to read PS-X EXE header \"%s\"\n", driver_psflib_path);
		delete driver_psflib;
		delete[] mem;
		return false;
	}

	uint32_t driver_load_address = readInt(&psx_exe_header[0x18]);
	uint32_t driver_load_size = readInt(&psx_exe_header[0x1c]);
	uint32_t initial_pc = readInt(&psx_exe_header[0x10]);
	uint32_t initial_sp = readInt(&psx_exe_header[0x30]);

	if (memcmp(psx_exe_header, "PS-X EXE", 8) != 0 || (driver_load_address & PSX_MEMORY_MASK) + driver_load_size >= PSX_MEMORY_SIZE) {
		fprintf(stderr, "Error: Invalid PS-X EXE header \"%s\"\n", driver_psflib_path);
		delete driver_psflib;
		delete[] mem;
		return false;
	}

	const char * region_name;
	if (strcmp((const char *)&psx_exe_header[0x4c], "Sony Computer Entertainment Inc. for Japan area") == 0) {
		region_name = "Japan";
	}
	else if (strcmp((const char *)&psx_exe_header[0x4c], "Sony Computer Entertainment Inc. for North America area") == 0) {
		region_name = "North America";
	}
	else if (strcmp((const char *)&psx_exe_header[0x4c], "Sony Computer Entertainment Inc. for Europe area") == 0) {
		region_name = "Europe";
	}
	else {
		fprintf(stderr, "Warning: Unknown region name \"%s\"\n", driver_psflib_path);
		region_name = "North America";
	}

	if (write_driver) {
		if (driver_psflib->compressed_exe.read(&mem[driver_load_address & PSX_MEMORY_MASK], driver_load_size) != driver_load_size) {
			fprintf(stderr, "Error: Unable to read driver block \"%s\"\n", driver_psflib_path);
			delete driver_psflib;
			delete[] mem;
			return false;
		}

		load_address = std::min<uint32_t>(load_address, driver_load_address);
		load_end_address = std::max<uint32_t>(load_end_address, driver_load_address + driver_load_size);
	}
	delete driver_psflib;

	if (tsq != NULL && tsq_size != 0) {
		memcpy(&mem[MY_SEQ & PSX_MEMORY_MASK], tsq, tsq_size);
		load_address = std::min<uint32_t>(load_address, MY_SEQ);
		load_end_address = std::max<uint32_t>(load_end_address, MY_SEQ + tsq_size);
	}

	if (tvb != NULL && tvb_size != 0) {
		memcpy(&mem[MY_INSTR & PSX_MEMORY_MASK], tvb, tvb_size);
		load_address = std::min<uint32_t>(load_address, MY_INSTR);
		load_end_address = std::max<uint32_t>(load_end_address, MY_INSTR + tvb_size);
	}

	if (write_param) {
		writeByte(&mem[MPARAM_SONGINDEX & PSX_MEMORY_MASK], song_index);
		load_address = std::min<uint32_t>(load_address, MINIPSF_PARAM);
		load_end_address = std::max<uint32_t>(load_end_address, MINIPSF_PARAM + 8);
	}

	uint32_t rom_size = load_end_address - load_address;

	if (!save_psf1(psf_path, &mem[load_address & PSX_MEMORY_MASK], load_address, rom_size, initial_pc, initial_sp, region_name, tags)) {
		delete[] mem;
		return false;
	}

	delete[] mem;
	return true;
}